

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParseComment(xmlParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  xmlParserInputState xVar2;
  commentSAXFunc p_Var3;
  xmlChar xVar4;
  int iVar5;
  uint val;
  uint uVar6;
  uint val_00;
  uint uVar7;
  xmlChar *pxVar8;
  xmlChar *val_01;
  xmlParserInputPtr pxVar9;
  char *pcVar10;
  size_t __n;
  ulong uVar11;
  long lVar12;
  xmlChar *pxVar13;
  ulong uVar14;
  size_t sVar15;
  int local_5c;
  int rl;
  int ql;
  ulong local_50;
  size_t local_48;
  int local_3c;
  xmlChar *local_38;
  
  uVar11 = 1000000000;
  if ((ctxt->options & 0x80000) == 0) {
    uVar11 = 10000000;
  }
  pxVar9 = ctxt->input;
  pxVar13 = pxVar9->cur;
  if (*pxVar13 != '<') {
    return;
  }
  if (pxVar13[1] != '!') {
    return;
  }
  if (pxVar13[2] != '-') {
    return;
  }
  if (pxVar13[3] != '-') {
    return;
  }
  xVar2 = ctxt->instate;
  ctxt->instate = XML_PARSER_COMMENT;
  iVar5 = pxVar9->id;
  pxVar9->cur = pxVar13 + 4;
  pxVar9->col = pxVar9->col + 4;
  if (pxVar13[4] == '\0') {
    xmlParserInputGrow(pxVar9,0xfa);
    pxVar9 = ctxt->input;
  }
  local_50 = CONCAT44(local_50._4_4_,iVar5);
  if (ctxt->progressive == 0) {
    if ((500 < (long)pxVar9->cur - (long)pxVar9->base) &&
       ((long)pxVar9->end - (long)pxVar9->cur < 500)) {
      xmlSHRINK(ctxt);
      pxVar9 = ctxt->input;
      if (ctxt->progressive != 0) goto LAB_00158b48;
    }
    if ((long)pxVar9->end - (long)pxVar9->cur < 0xfa) {
      xmlGROW(ctxt);
      pxVar9 = ctxt->input;
    }
  }
LAB_00158b48:
  pxVar13 = pxVar9->cur;
  xVar4 = *pxVar13;
  sVar15 = 100;
  uVar14 = 0;
  val_01 = (xmlChar *)0x0;
  do {
    if (xVar4 == '\n') {
      iVar5 = pxVar9->line;
      pxVar8 = pxVar13;
      do {
        iVar5 = iVar5 + 1;
        pxVar9->line = iVar5;
        pxVar9->col = 1;
        pxVar13 = pxVar8 + 1;
        pxVar1 = pxVar8 + 1;
        pxVar8 = pxVar13;
      } while (*pxVar1 == '\n');
    }
LAB_00158b90:
    iVar5 = pxVar9->col;
    while( true ) {
      for (; (xVar4 = *pxVar13, '-' < (char)xVar4 || (xVar4 == '\t' || (byte)(xVar4 - 0x20) < 0xd));
          pxVar13 = pxVar13 + 1) {
        iVar5 = iVar5 + 1;
      }
      pxVar9->col = iVar5;
      if (*pxVar13 != '\n') break;
      iVar5 = pxVar9->line;
      do {
        iVar5 = iVar5 + 1;
        pxVar9->line = iVar5;
        pxVar9->col = 1;
        pxVar8 = pxVar13 + 1;
        pxVar13 = pxVar13 + 1;
      } while (*pxVar8 == '\n');
      iVar5 = 1;
    }
    __n = (long)pxVar13 - (long)pxVar9->cur;
    if (((__n != 0) && (ctxt->sax != (_xmlSAXHandler *)0x0)) &&
       (ctxt->sax->comment != (commentSAXFunc)0x0)) {
      if (val_01 == (xmlChar *)0x0) {
        if ((*pxVar13 != '-') || (lVar12 = 1, pxVar13[1] != '-')) {
          lVar12 = 100;
        }
        local_48 = lVar12 + __n;
        pxVar8 = (xmlChar *)(*xmlMallocAtomic)(local_48);
        if (pxVar8 == (xmlChar *)0x0) goto LAB_00158fce;
        uVar14 = 0;
      }
      else {
        pxVar8 = val_01;
        local_48 = sVar15;
        if (sVar15 <= uVar14 + 1 + __n) {
          local_48 = sVar15 + 100 + __n + uVar14;
          pxVar8 = (xmlChar *)(*xmlRealloc)(val_01,local_48);
          if (pxVar8 == (xmlChar *)0x0) {
            (*xmlFree)(val_01);
            goto LAB_00158fce;
          }
        }
      }
      val_01 = pxVar8;
      memcpy(val_01 + uVar14,ctxt->input->cur,__n);
      uVar14 = uVar14 + __n;
      val_01[uVar14] = '\0';
      sVar15 = local_48;
    }
    if (uVar11 < uVar14) {
      xmlFatalErrMsgStr(ctxt,XML_ERR_COMMENT_NOT_FINISHED,"Comment too big found",(xmlChar *)0x0);
LAB_00158fad:
      (*xmlFree)(val_01);
      return;
    }
    pxVar9 = ctxt->input;
    pxVar9->cur = pxVar13;
    xVar4 = *pxVar13;
    pxVar8 = pxVar13;
    if (xVar4 == '\n') {
      pxVar9->line = pxVar9->line + 1;
      pxVar8 = pxVar13 + 1;
      pxVar9->col = 1;
      xVar4 = pxVar13[1];
    }
    if ((xVar4 == '\r') && (pxVar8[1] == '\n')) {
      pxVar9->cur = pxVar8 + 1;
      pxVar9->line = pxVar9->line + 1;
      pxVar13 = pxVar8 + 2;
      pxVar9->col = 1;
      goto LAB_00158b90;
    }
    if ((ctxt->progressive == 0) &&
       (((((long)pxVar13 - (long)pxVar9->base < 0x1f5 || (499 < (long)pxVar9->end - (long)pxVar13))
         || (xmlSHRINK(ctxt), ctxt->progressive == 0)) &&
        ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)))) {
      xmlGROW(ctxt);
    }
    if (ctxt->instate == XML_PARSER_EOF) goto LAB_00158fad;
    pxVar9 = ctxt->input;
    pxVar13 = pxVar9->cur;
    xVar4 = *pxVar13;
    if (xVar4 == '-') {
      if (pxVar13[1] == '-') {
        if (pxVar13[2] == '>') {
          if (pxVar9->id != (int)local_50) {
            xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                           "comment doesn\'t start and stop in the same entity\n");
            pxVar9 = ctxt->input;
            pxVar13 = pxVar9->cur;
          }
          pxVar9->cur = pxVar13 + 3;
          pxVar9->col = pxVar9->col + 3;
          if (pxVar13[3] == '\0') {
            xmlParserInputGrow(pxVar9,0xfa);
          }
          if (((ctxt->sax == (_xmlSAXHandler *)0x0) ||
              (p_Var3 = ctxt->sax->comment, p_Var3 == (commentSAXFunc)0x0)) ||
             (ctxt->disableSAX != 0)) {
            if (val_01 != (xmlChar *)0x0) goto LAB_00158f8c;
          }
          else if (val_01 == (xmlChar *)0x0) {
            (*p_Var3)(ctxt->userData,"");
          }
          else {
            (*p_Var3)(ctxt->userData,val_01);
LAB_00158f8c:
            (*xmlFree)(val_01);
          }
          if (ctxt->instate == XML_PARSER_EOF) {
            return;
          }
          goto LAB_00158fd8;
        }
        if (val_01 == (xmlChar *)0x0) {
          pcVar10 = "Double hyphen within comment\n";
          pxVar8 = (xmlChar *)0x0;
        }
        else {
          pcVar10 = "Double hyphen within comment: <!--%.50s\n";
          pxVar8 = val_01;
        }
        xmlFatalErrMsgStr(ctxt,XML_ERR_HYPHEN_IN_COMMENT,pcVar10,pxVar8);
        if (ctxt->instate == XML_PARSER_EOF) goto LAB_00158fad;
        pxVar13 = pxVar13 + 1;
        pxVar9 = ctxt->input;
        iVar5 = pxVar9->col + 1;
        pxVar9->col = iVar5;
      }
      else {
        iVar5 = pxVar9->col;
      }
      pxVar13 = pxVar13 + 1;
      pxVar9->col = iVar5 + 1;
      goto LAB_00158b90;
    }
  } while ((byte)(xVar4 - 9) < 2 || '\x1f' < (char)xVar4);
  uVar11 = 1000000000;
  if ((ctxt->options & 0x80000) == 0) {
    uVar11 = 10000000;
  }
  iVar5 = pxVar9->id;
  if (val_01 == (xmlChar *)0x0) {
    sVar15 = 100;
    val_01 = (xmlChar *)(*xmlMallocAtomic)(100);
    if (val_01 == (xmlChar *)0x0) {
LAB_00158fce:
      xmlErrMemory(ctxt,(char *)0x0);
      goto LAB_00158fd8;
    }
    uVar14 = 0;
  }
  local_48 = sVar15;
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  val = xmlCurrentChar(ctxt,&ql);
  if (val == 0) {
LAB_001593a8:
    pcVar10 = "Comment not terminated\n";
LAB_001593af:
    xmlFatalErrMsgStr(ctxt,XML_ERR_COMMENT_NOT_FINISHED,pcVar10,(xmlChar *)0x0);
  }
  else {
    if ((int)val < 0x100) {
      if ((0x1f < (int)val) || ((val < 0xe && ((0x2600U >> (val & 0x1f) & 1) != 0))))
      goto LAB_00159046;
    }
    else if (val - 0x10000 < 0x100000 || (val - 0xe000 < 0x1ffe || val < 0xd800)) {
LAB_00159046:
      pxVar9 = ctxt->input;
      if (*pxVar9->cur == '\n') {
        pxVar9->line = pxVar9->line + 1;
        pxVar9->col = 1;
      }
      else {
        pxVar9->col = pxVar9->col + 1;
      }
      pxVar9->cur = pxVar9->cur + ql;
      uVar6 = xmlCurrentChar(ctxt,&rl);
      if (uVar6 == 0) goto LAB_001593a8;
      if ((int)uVar6 < 0x100) {
        if ((0x1f < (int)uVar6) || ((uVar6 < 0xe && ((0x2600U >> (uVar6 & 0x1f) & 1) != 0)))) {
LAB_001590a4:
          pxVar9 = ctxt->input;
          if (*pxVar9->cur == '\n') {
            pxVar9->line = pxVar9->line + 1;
            pxVar9->col = 1;
          }
          else {
            pxVar9->col = pxVar9->col + 1;
          }
          pxVar9->cur = pxVar9->cur + rl;
          local_3c = iVar5;
          val_00 = xmlCurrentChar(ctxt,&local_5c);
          if (val_00 == 0) goto LAB_001593a8;
          local_50 = 0;
          do {
            if (0xff < (int)val_00) {
              if (val_00 - 0x10000 < 0x100000 || (val_00 - 0xe000 < 0x1ffe || val_00 < 0xd800))
              goto LAB_0015919b;
              val_01[uVar14] = '\0';
LAB_00159440:
              xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,
                                "xmlParseComment: invalid xmlChar value %d\n",val_00);
LAB_00159454:
              (*xmlFree)(val_01);
              goto LAB_00158fd8;
            }
            if (((int)val_00 < 0x20) && ((0xd < val_00 || ((0x2600U >> (val_00 & 0x1f) & 1) == 0))))
            {
              val_01[uVar14] = '\0';
              if (val_00 != 0) goto LAB_00159440;
              xmlFatalErrMsgStr(ctxt,XML_ERR_COMMENT_NOT_FINISHED,
                                "Comment not terminated \n<!--%.50s\n",val_01);
              goto LAB_00159454;
            }
LAB_0015919b:
            if ((val_00 == 0x3e && (uVar6 ^ 0x2d) == 0) && (val ^ 0x2d) == 0) {
              val_01[uVar14] = '\0';
              if (local_3c != ctxt->input->id) {
                xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                               "Comment doesn\'t start and stop in the same entity\n");
              }
              xmlNextChar(ctxt);
              if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
                  (p_Var3 = ctxt->sax->comment, p_Var3 != (commentSAXFunc)0x0)) &&
                 (ctxt->disableSAX == 0)) {
                (*p_Var3)(ctxt->userData,val_01);
              }
              goto LAB_00159454;
            }
            if ((uVar6 ^ 0x2d) == 0 && (val ^ 0x2d) == 0) {
              xmlFatalErr(ctxt,XML_ERR_HYPHEN_IN_COMMENT,(char *)0x0);
            }
            pxVar13 = val_01;
            if (local_48 <= uVar14 + 5) {
              local_48 = local_48 * 2;
              pxVar13 = (xmlChar *)(*xmlRealloc)(val_01,local_48);
              if (pxVar13 == (xmlChar *)0x0) {
                (*xmlFree)(val_01);
                goto LAB_00158fce;
              }
            }
            local_38 = pxVar13;
            if (ql == 1) {
              pxVar13[uVar14] = (xmlChar)val;
              uVar14 = uVar14 + 1;
            }
            else {
              iVar5 = xmlCopyCharMultiByte(pxVar13 + uVar14,val);
              uVar14 = uVar14 + (long)iVar5;
            }
            ql = rl;
            rl = local_5c;
            if (local_50 < 0x32) {
              local_50 = local_50 + 1;
            }
            else {
              if (ctxt->progressive == 0) {
                pxVar9 = ctxt->input;
                pxVar13 = pxVar9->cur;
                if ((500 < (long)pxVar13 - (long)pxVar9->base) &&
                   ((long)pxVar9->end - (long)pxVar13 < 500)) {
                  xmlSHRINK(ctxt);
                  if (ctxt->progressive != 0) goto LAB_001592b4;
                  pxVar9 = ctxt->input;
                  pxVar13 = pxVar9->cur;
                }
                if ((long)pxVar9->end - (long)pxVar13 < 0xfa) {
                  xmlGROW(ctxt);
                }
              }
LAB_001592b4:
              val_01 = local_38;
              if (ctxt->instate == XML_PARSER_EOF) goto LAB_001593c6;
              local_50 = 0;
            }
            pxVar9 = ctxt->input;
            if (*pxVar9->cur == '\n') {
              pxVar9->line = pxVar9->line + 1;
              pxVar9->col = 1;
            }
            else {
              pxVar9->col = pxVar9->col + 1;
            }
            pxVar9->cur = pxVar9->cur + local_5c;
            uVar7 = xmlCurrentChar(ctxt,&local_5c);
            if (uVar7 == 0) {
              if (ctxt->progressive == 0) {
                pxVar9 = ctxt->input;
                pxVar13 = pxVar9->cur;
                if ((500 < (long)pxVar13 - (long)pxVar9->base) &&
                   ((long)pxVar9->end - (long)pxVar13 < 500)) {
                  xmlSHRINK(ctxt);
                  if (ctxt->progressive != 0) goto LAB_00159379;
                  pxVar9 = ctxt->input;
                  pxVar13 = pxVar9->cur;
                }
                if ((long)pxVar9->end - (long)pxVar13 < 0xfa) {
                  xmlGROW(ctxt);
                }
              }
LAB_00159379:
              uVar7 = xmlCurrentChar(ctxt,&local_5c);
            }
            val_01 = local_38;
            val = uVar6;
            uVar6 = val_00;
            val_00 = uVar7;
          } while (uVar14 <= uVar11);
          pcVar10 = "Comment too big found";
          goto LAB_001593af;
        }
      }
      else if (uVar6 - 0x10000 < 0x100000 || (uVar6 - 0xe000 < 0x1ffe || uVar6 < 0xd800))
      goto LAB_001590a4;
    }
    xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,"xmlParseComment: invalid xmlChar value %d\n",val);
  }
LAB_001593c6:
  (*xmlFree)(val_01);
LAB_00158fd8:
  ctxt->instate = xVar2;
  return;
}

Assistant:

void
xmlParseComment(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    size_t size = XML_PARSER_BUFFER_SIZE;
    size_t len = 0;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_HUGE_LENGTH :
                       XML_MAX_TEXT_LENGTH;
    xmlParserInputState state;
    const xmlChar *in;
    size_t nbchar = 0;
    int ccol;
    int inputid;

    /*
     * Check that there is a comment right here.
     */
    if ((RAW != '<') || (NXT(1) != '!') ||
        (NXT(2) != '-') || (NXT(3) != '-')) return;
    state = ctxt->instate;
    ctxt->instate = XML_PARSER_COMMENT;
    inputid = ctxt->input->id;
    SKIP(4);
    SHRINK;
    GROW;

    /*
     * Accelerated common case where input don't need to be
     * modified before passing it to the handler.
     */
    in = ctxt->input->cur;
    do {
	if (*in == 0xA) {
	    do {
		ctxt->input->line++; ctxt->input->col = 1;
		in++;
	    } while (*in == 0xA);
	}
get_more:
        ccol = ctxt->input->col;
	while (((*in > '-') && (*in <= 0x7F)) ||
	       ((*in >= 0x20) && (*in < '-')) ||
	       (*in == 0x09)) {
		    in++;
		    ccol++;
	}
	ctxt->input->col = ccol;
	if (*in == 0xA) {
	    do {
		ctxt->input->line++; ctxt->input->col = 1;
		in++;
	    } while (*in == 0xA);
	    goto get_more;
	}
	nbchar = in - ctxt->input->cur;
	/*
	 * save current set of data
	 */
	if (nbchar > 0) {
	    if ((ctxt->sax != NULL) &&
		(ctxt->sax->comment != NULL)) {
		if (buf == NULL) {
		    if ((*in == '-') && (in[1] == '-'))
		        size = nbchar + 1;
		    else
		        size = XML_PARSER_BUFFER_SIZE + nbchar;
		    buf = (xmlChar *) xmlMallocAtomic(size);
		    if (buf == NULL) {
		        xmlErrMemory(ctxt, NULL);
			ctxt->instate = state;
			return;
		    }
		    len = 0;
		} else if (len + nbchar + 1 >= size) {
		    xmlChar *new_buf;
		    size  += len + nbchar + XML_PARSER_BUFFER_SIZE;
		    new_buf = (xmlChar *) xmlRealloc(buf, size);
		    if (new_buf == NULL) {
		        xmlFree (buf);
			xmlErrMemory(ctxt, NULL);
			ctxt->instate = state;
			return;
		    }
		    buf = new_buf;
		}
		memcpy(&buf[len], ctxt->input->cur, nbchar);
		len += nbchar;
		buf[len] = 0;
	    }
	}
        if (len > maxLength) {
            xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
                         "Comment too big found", NULL);
            xmlFree (buf);
            return;
        }
	ctxt->input->cur = in;
	if (*in == 0xA) {
	    in++;
	    ctxt->input->line++; ctxt->input->col = 1;
	}
	if (*in == 0xD) {
	    in++;
	    if (*in == 0xA) {
		ctxt->input->cur = in;
		in++;
		ctxt->input->line++; ctxt->input->col = 1;
		goto get_more;
	    }
	    in--;
	}
	SHRINK;
	GROW;
        if (ctxt->instate == XML_PARSER_EOF) {
            xmlFree(buf);
            return;
        }
	in = ctxt->input->cur;
	if (*in == '-') {
	    if (in[1] == '-') {
	        if (in[2] == '>') {
		    if (ctxt->input->id != inputid) {
			xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
			               "comment doesn't start and stop in the"
                                       " same entity\n");
		    }
		    SKIP(3);
		    if ((ctxt->sax != NULL) && (ctxt->sax->comment != NULL) &&
		        (!ctxt->disableSAX)) {
			if (buf != NULL)
			    ctxt->sax->comment(ctxt->userData, buf);
			else
			    ctxt->sax->comment(ctxt->userData, BAD_CAST "");
		    }
		    if (buf != NULL)
		        xmlFree(buf);
		    if (ctxt->instate != XML_PARSER_EOF)
			ctxt->instate = state;
		    return;
		}
		if (buf != NULL) {
		    xmlFatalErrMsgStr(ctxt, XML_ERR_HYPHEN_IN_COMMENT,
		                      "Double hyphen within comment: "
                                      "<!--%.50s\n",
				      buf);
		} else
		    xmlFatalErrMsgStr(ctxt, XML_ERR_HYPHEN_IN_COMMENT,
		                      "Double hyphen within comment\n", NULL);
                if (ctxt->instate == XML_PARSER_EOF) {
                    xmlFree(buf);
                    return;
                }
		in++;
		ctxt->input->col++;
	    }
	    in++;
	    ctxt->input->col++;
	    goto get_more;
	}
    } while (((*in >= 0x20) && (*in <= 0x7F)) || (*in == 0x09) || (*in == 0x0a));
    xmlParseCommentComplex(ctxt, buf, len, size);
    ctxt->instate = state;
    return;
}